

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write(basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *this,int __fd,void *__buf,size_t __n)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> *__obj;
  undefined4 in_register_00000034;
  ostream_iterator<char,_char,_std::char_traits<char>_> *it;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffffb0;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_40;
  ostream_type *local_30;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_ffffffffffffffd8;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *begin;
  basic_string_view<char> local_10;
  
  local_10.data_ = (char *)CONCAT44(in_register_00000034,__fd);
  begin = this;
  local_10.size_ = (size_t)__buf;
  basic_string_view<char>::size(&local_10);
  __obj = reserve(in_stack_ffffffffffffffb0,(size_t)this);
  basic_string_view<char>::begin(&local_10);
  basic_string_view<char>::end(&local_10);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_40,__obj);
  internal::copy_str<char,char_const*,std::ostream_iterator<char,char,std::char_traits<char>>>
            ((char *)begin,(char *)__obj,in_stack_ffffffffffffffd8);
  __obj->_M_stream = local_30;
  __obj->_M_string = (char *)in_stack_ffffffffffffffd8;
  return (ssize_t)__obj;
}

Assistant:

void write(string_view value) {
    auto &&it = reserve(value.size());
    it = internal::copy_str<char_type>(value.begin(), value.end(), it);
  }